

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this)

{
  string *in_RDI;
  
  pzgeom::TPZGeoLinear::TypeName_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }